

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O3

void PrintInventory(vector<Car,_std::allocator<Car>_> *cars)

{
  pointer pCVar1;
  pointer pCVar2;
  char cVar3;
  long lVar4;
  ulong in_RAX;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int iStack_84;
  vector<Car,_std::allocator<Car>_> vStack_80;
  vector<Car,_std::allocator<Car>_> *pvStack_68;
  ostream *poStack_60;
  long lStack_58;
  char *pcStack_50;
  undefined8 uStack_48;
  code *pcStack_40;
  ulong local_38;
  
  pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pCVar2 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcStack_40 = (code *)0x103a75;
  local_38 = in_RAX;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  pcStack_40 = (code *)0x103a80;
  std::ostream::put(-0x60);
  pcStack_40 = (code *)0x103a88;
  poVar5 = (ostream *)std::ostream::flush();
  cVar3 = (char)poVar5;
  if (pCVar1 == pCVar2) {
    pcStack_40 = (code *)0x10424b;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"No cars in inventory!",0x15);
    pcStack_40 = (code *)0x10425f;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
    pcStack_40 = (code *)0x10426a;
    std::ostream::put(cVar3);
    pcStack_40 = (code *)0x104272;
    plVar6 = (long *)std::ostream::flush();
    pcStack_40 = (code *)0x104289;
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    pcStack_40 = (code *)0x104294;
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    return;
  }
  pcStack_40 = (code *)0x103aa8;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
  pcStack_40 = (code *)0x103ab3;
  std::ostream::put(cVar3);
  pcStack_40 = (code *)0x103abb;
  std::ostream::flush();
  pcStack_40 = (code *)0x103acf;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Inventory printout:",0x13);
  pcStack_40 = (code *)0x103ae3;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  pcStack_40 = (code *)0x103aee;
  std::ostream::put(-0x60);
  pcStack_40 = (code *)0x103af6;
  plVar6 = (long *)std::ostream::flush();
  pcStack_40 = (code *)0x103b0d;
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  pcStack_40 = (code *)0x103b18;
  std::ostream::put((char)plVar6);
  pcStack_40 = (code *)0x103b20;
  std::ostream::flush();
  if ((cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      pcVar10 = (char *)&std::cout;
      pcStack_40 = (code *)0x103b50;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Car ",4);
      local_38 = uVar8 + 1;
      pcStack_40 = (code *)0x103b60;
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_38);
      pcStack_40 = (code *)0x103b77;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      pcStack_40 = (code *)0x103b82;
      std::ostream::put((char)plVar6);
      pcStack_40 = (code *)0x103b8a;
      poVar5 = (ostream *)std::ostream::flush();
      pcStack_40 = (code *)0x103ba1;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103bac;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103bb4;
      std::ostream::flush();
      pcStack_40 = (code *)0x103bc8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Make: ",6);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
LAB_001042aa:
        pcStack_40 = main;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
        uStack_48 = 0xeeeeeeeeeeeeeeef;
        vStack_80.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vStack_80.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        vStack_80.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        pvStack_68 = cars;
        poStack_60 = poVar5;
        lStack_58 = lVar9;
        pcStack_50 = pcVar10;
        pcStack_40 = (code *)uVar8;
        do {
          iStack_84 = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Welcome to the car inventory system!",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Please chose a number:",0x16);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1) Add car",10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"2) List inventory",0x11);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"3) Display profit",0x11);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4) Quit",7);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Choice [1-4]: ",0xe);
          std::istream::operator>>((istream *)&std::cin,&iStack_84);
          switch(iStack_84) {
          case 1:
            AddCar(&vStack_80);
            break;
          case 2:
            PrintInventory(&vStack_80);
            break;
          case 3:
            CalculateProfit(&vStack_80);
            break;
          case 4:
            exit(0);
          }
        } while( true );
      }
      pcStack_40 = (code *)0x103bf4;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          *(char **)((long)&(pCVar1->make)._M_dataplus._M_p + lVar9),
                          *(long *)((long)&(pCVar1->make)._M_string_length + lVar9));
      pcStack_40 = (code *)0x103c0b;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103c16;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103c1e;
      std::ostream::flush();
      pcStack_40 = (code *)0x103c32;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model: ",7);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
      pcStack_40 = (code *)0x103c5f;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          *(char **)((long)&(pCVar1->model)._M_dataplus._M_p + lVar9),
                          *(long *)((long)&(pCVar1->model)._M_string_length + lVar9));
      pcStack_40 = (code *)0x103c76;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103c81;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103c89;
      std::ostream::flush();
      pcStack_40 = (code *)0x103c9d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Year: ",6);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
      pcStack_40 = (code *)0x103cc5;
      poVar5 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)&pCVar1->year + lVar9))
      ;
      pcStack_40 = (code *)0x103cdc;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103ce7;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103cef;
      std::ostream::flush();
      pcStack_40 = (code *)0x103d03;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Purchase price: $",0x11);
      lVar4 = std::cout;
      *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 2;
      *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) =
           *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
      pcStack_40 = (code *)0x103d55;
      poVar5 = std::ostream::_M_insert<double>(*(double *)((long)&pCVar1->purchasePrice + lVar9));
      pcStack_40 = (code *)0x103d6c;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103d77;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103d7f;
      std::ostream::flush();
      pcStack_40 = (code *)0x103d93;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Date purchased: ",0x10);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
      pcStack_40 = (code *)0x103dbb;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)((long)&(pCVar1->datePurchased).month + lVar9));
      pcVar10 = "/";
      pcStack_40 = (code *)0x103dd5;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
      pcStack_40 = (code *)0x103dfd;
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,*(int *)((long)&(pCVar1->datePurchased).day + lVar9))
      ;
      pcStack_40 = (code *)0x103e10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
      pcStack_40 = (code *)0x103e38;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)((long)&(pCVar1->datePurchased).year + lVar9));
      pcStack_40 = (code *)0x103e4f;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x103e5a;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x103e62;
      std::ostream::flush();
      pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
      pcVar10 = (char *)&std::cout;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
      if ((&pCVar1->isSold)[lVar9] == true) {
        pcStack_40 = (code *)0x103ea4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Status: SOLD",0xc)
        ;
        pcStack_40 = (code *)0x103eb8;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x103ec3;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x103ecb;
        std::ostream::flush();
        pcStack_40 = (code *)0x103edf;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sale Price: $",0xd);
        lVar4 = std::cout;
        *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 2;
        *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) =
             *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
        pcStack_40 = (code *)0x103f31;
        poVar5 = std::ostream::_M_insert<double>(*(double *)((long)&pCVar1->salePrice + lVar9));
        pcStack_40 = (code *)0x103f48;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        pcStack_40 = (code *)0x103f53;
        std::ostream::put((char)poVar5);
        pcStack_40 = (code *)0x103f5b;
        std::ostream::flush();
        pcStack_40 = (code *)0x103f6f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Date sold: ",0xb);
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
        pcStack_40 = (code *)0x103f97;
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(int *)((long)&(pCVar1->dateSold).month + lVar9))
        ;
        pcVar10 = "/";
        pcStack_40 = (code *)0x103fb1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
        pcStack_40 = (code *)0x103fd9;
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,*(int *)((long)&(pCVar1->dateSold).day + lVar9));
        pcStack_40 = (code *)0x103fec;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
        pcStack_40 = (code *)0x104014;
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,*(int *)((long)&(pCVar1->dateSold).year + lVar9));
        pcStack_40 = (code *)0x10402b;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        pcStack_40 = (code *)0x104036;
        std::ostream::put((char)poVar5);
        pcStack_40 = (code *)0x10403e;
        std::ostream::flush();
        pcVar10 = (char *)&std::cout;
        pcStack_40 = (code *)0x104059;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Profit: $",9);
        lVar4 = std::cout;
        *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 2;
        *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) =
             *(uint *)(__cxa_rethrow + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
        pCVar1 = (cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x1111111111111111;
        if (uVar7 < uVar8 || uVar7 - uVar8 == 0) goto LAB_001042aa;
        pcStack_40 = (code *)0x1040b2;
        poVar5 = std::ostream::_M_insert<double>
                           (*(double *)((long)&pCVar1->salePrice + lVar9) -
                            *(double *)((long)&pCVar1->purchasePrice + lVar9));
      }
      else {
        pcStack_40 = (code *)0x1040ce;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Status: NOT SOLD",0x10);
        pcStack_40 = (code *)0x1040e2;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x1040ed;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x1040f5;
        std::ostream::flush();
        pcStack_40 = (code *)0x104109;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sale price: N/A",0xf);
        pcStack_40 = (code *)0x10411d;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x104128;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x104130;
        std::ostream::flush();
        pcStack_40 = (code *)0x104144;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sale date: N/A",0xe);
        pcStack_40 = (code *)0x104158;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        pcStack_40 = (code *)0x104163;
        std::ostream::put(-0x60);
        pcStack_40 = (code *)0x10416b;
        std::ostream::flush();
        pcStack_40 = (code *)0x10417f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Profit: N/A",0xb);
        poVar5 = (ostream *)&std::cout;
      }
      pcStack_40 = (code *)0x104197;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_40 = (code *)0x1041a2;
      std::ostream::put((char)poVar5);
      pcStack_40 = (code *)0x1041aa;
      std::ostream::flush();
      pcStack_40 = (code *)0x1041be;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      pcStack_40 = (code *)0x1041c9;
      std::ostream::put(-0x60);
      pcStack_40 = (code *)0x1041d1;
      plVar6 = (long *)std::ostream::flush();
      pcStack_40 = (code *)0x1041e8;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      pcStack_40 = (code *)0x1041f3;
      std::ostream::put((char)plVar6);
      pcStack_40 = (code *)0x1041fb;
      std::ostream::flush();
      uVar7 = ((long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(cars->super__Vector_base<Car,_std::allocator<Car>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      lVar9 = lVar9 + 0x78;
      uVar8 = local_38;
    } while (local_38 <= uVar7 && uVar7 - local_38 != 0);
  }
  return;
}

Assistant:

void PrintInventory(vector<Car> &cars)
{

    if(cars.size() == 0)
    {
        cout << endl << "No cars in inventory!" << endl << endl;
        return;
    }

    cout << endl << endl;
    cout << "Inventory printout:";
    cout << endl << endl;

    for(int i = 0; i < cars.size(); i++)
    {
        cout << "Car " << (i + 1) << endl << endl;
        cout << "Make: " << cars.at(i).make << endl;
        cout << "Model: " << cars.at(i).model << endl;
        cout << "Year: " << cars.at(i).year << endl;
        cout << "Purchase price: $" << setprecision(2) << fixed << cars.at(i).purchasePrice << endl;
        cout << "Date purchased: " << cars.at(i).datePurchased.month << "/" << cars.at(i).datePurchased.day <<
                "/" << cars.at(i).datePurchased.year << endl;
        if(cars.at(i).isSold)
        {
            cout << "Status: SOLD" << endl;
            cout << "Sale Price: $" << setprecision(2) << fixed << cars.at(i).salePrice << endl;
            cout << "Date sold: " << cars.at(i).dateSold.month << "/" << cars.at(i).dateSold.day <<
                    "/" << cars.at(i).dateSold.year << endl;
            cout << "Profit: $" << setprecision(2) << fixed << (cars.at(i).salePrice - cars.at(i).purchasePrice) << endl;

        }
        else
        {
            cout << "Status: NOT SOLD" << endl;
            cout << "Sale price: N/A" << endl;
            cout << "Sale date: N/A" << endl;
            cout << "Profit: N/A" << endl;
        }

        cout << endl << endl;
    }
}